

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<roundTripString_rtripconversions_Test>::CreateTest
          (ParameterizedTestFactory<roundTripString_rtripconversions_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::__cxx11::string>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  roundTripString_rtripconversions_Test::roundTripString_rtripconversions_Test
            ((roundTripString_rtripconversions_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }